

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCIIRangeFactory.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::ASCIIRangeFactory::buildRanges(ASCIIRangeFactory *this,RangeTokenMap *rangeTokMap)

{
  TokenFactory *this_00;
  RangeToken *pRVar1;
  
  if ((this->super_RangeFactory).fRangesCreated == false) {
    if ((this->super_RangeFactory).fKeywordsInitialized == false) {
      (*(this->super_RangeFactory)._vptr_RangeFactory[2])(this);
    }
    this_00 = rangeTokMap->fTokenFactory;
    pRVar1 = TokenFactory::createRange(this_00,false);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,9,9);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,10,10);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0xc,0xc);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0xd,0xd);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x20,0x20);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIISpace,pRVar1,false);
    pRVar1 = RangeToken::complementRanges(pRVar1,this_00,XMLPlatformUtils::fgMemoryManager);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIISpace,pRVar1,true);
    pRVar1 = TokenFactory::createRange(this_00,false);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x30,0x39);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIIDigit,pRVar1,false);
    pRVar1 = RangeToken::complementRanges(pRVar1,this_00,XMLPlatformUtils::fgMemoryManager);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIIDigit,pRVar1,true);
    pRVar1 = TokenFactory::createRange(this_00,false);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x30,0x39);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x41,0x5a);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x5f,0x5f);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x61,0x7a);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIIWord,pRVar1,false);
    pRVar1 = RangeToken::complementRanges(pRVar1,this_00,XMLPlatformUtils::fgMemoryManager);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIIWord,pRVar1,true);
    pRVar1 = TokenFactory::createRange(this_00,false);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x30,0x39);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x41,0x46);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0x61,0x61);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIIXDigit,pRVar1,false);
    pRVar1 = RangeToken::complementRanges(pRVar1,this_00,XMLPlatformUtils::fgMemoryManager);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCIIXDigit,pRVar1,true);
    pRVar1 = TokenFactory::createRange(this_00,false);
    (*(pRVar1->super_Token)._vptr_Token[0xc])(pRVar1,0,0x7f);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCII,pRVar1,false);
    pRVar1 = RangeToken::complementRanges(pRVar1,this_00,XMLPlatformUtils::fgMemoryManager);
    if (pRVar1->fMap == (int *)0x0) {
      RangeToken::doCreateMap(pRVar1);
    }
    RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)fgASCII,pRVar1,true);
    (this->super_RangeFactory).fRangesCreated = true;
  }
  return;
}

Assistant:

void ASCIIRangeFactory::buildRanges(RangeTokenMap *rangeTokMap) {

    if (fRangesCreated)
        return;

    if (!fKeywordsInitialized) {
        initializeKeywordMap(rangeTokMap);
    }

    TokenFactory* tokFactory = rangeTokMap->getTokenFactory();

    // Create space ranges
    RangeToken* tok = tokFactory->createRange();
    tok->addRange(chHTab, chHTab);
    tok->addRange(chLF, chLF);
    tok->addRange(chFF, chFF);
    tok->addRange(chCR, chCR);
    tok->addRange(chSpace, chSpace);

    // Build the internal map.
    tok->createMap();

    rangeTokMap->setRangeToken(fgASCIISpace, tok);

    tok = RangeToken::complementRanges(tok, tokFactory);

    // Build the internal map.
    tok->createMap();

    rangeTokMap->setRangeToken(fgASCIISpace, tok , true);

    // Create digits ranges
    tok = tokFactory->createRange();
    tok->addRange(chDigit_0, chDigit_9);

    // Build the internal map.
    tok->createMap();

    rangeTokMap->setRangeToken(fgASCIIDigit, tok);

    tok = RangeToken::complementRanges(tok, tokFactory);

    // Build the internal map.
    tok->createMap();

    rangeTokMap->setRangeToken(fgASCIIDigit, tok , true);

    // Create word ranges
    tok = tokFactory->createRange();
    tok->addRange(chDigit_0, chDigit_9);
    tok->addRange(chLatin_A, chLatin_Z);
    tok->addRange(chUnderscore, chUnderscore);
    tok->addRange(chLatin_a, chLatin_z);
    // Build the internal map.
    tok->createMap();
    rangeTokMap->setRangeToken(fgASCIIWord, tok);

    tok = RangeToken::complementRanges(tok, tokFactory);
    // Build the internal map.
    tok->createMap();
    rangeTokMap->setRangeToken(fgASCIIWord, tok , true);

    // Create xdigit ranges
    tok = tokFactory->createRange();
    tok->addRange(chDigit_0, chDigit_9);
    tok->addRange(chLatin_A, chLatin_F);
    tok->addRange(chLatin_a, chLatin_a);
    // Build the internal map.
    tok->createMap();

    rangeTokMap->setRangeToken(fgASCIIXDigit, tok);

    tok = RangeToken::complementRanges(tok, tokFactory);
    // Build the internal map.
    tok->createMap();
    rangeTokMap->setRangeToken(fgASCIIXDigit, tok , true);

    // Create ascii ranges
    tok = tokFactory->createRange();
    tok->addRange(0x00, 0x7F);
    // Build the internal map.
    tok->createMap();
    rangeTokMap->setRangeToken(fgASCII, tok);

    tok = RangeToken::complementRanges(tok, tokFactory);
    // Build the internal map.
    tok->createMap();
    rangeTokMap->setRangeToken(fgASCII, tok , true);

    fRangesCreated = true;
}